

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_set_hflag(DisasContext *s,uint32_t mask)

{
  TCGContext *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 t;
  TCGContext *tcg_ctx;
  uint32_t mask_local;
  DisasContext *s_local;
  
  if ((s->flags & (ulong)mask) == 0) {
    tcg_ctx_00 = s->uc->tcg_ctx;
    ret = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_ld_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0xb0);
    tcg_gen_ori_i32_x86_64(tcg_ctx_00,ret,ret,mask);
    tcg_gen_st_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0xb0);
    tcg_temp_free_i32(tcg_ctx_00,ret);
    s->flags = (ulong)mask | s->flags;
  }
  return;
}

Assistant:

static void gen_set_hflag(DisasContext *s, uint32_t mask)
{
    if ((s->flags & mask) == 0) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;

        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_ld_i32(tcg_ctx, t, tcg_ctx->cpu_env, offsetof(CPUX86State, hflags));
        tcg_gen_ori_i32(tcg_ctx, t, t, mask);
        tcg_gen_st_i32(tcg_ctx, t, tcg_ctx->cpu_env, offsetof(CPUX86State, hflags));
        tcg_temp_free_i32(tcg_ctx, t);
        s->flags |= mask;
    }
}